

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseOffsetExprOpt(WastParser *this,ExprList *out_expr_list)

{
  bool bVar1;
  Result RVar2;
  ExprList *out_expr_list_local;
  WastParser *this_local;
  
  bVar1 = MatchLpar(this,Offset);
  if (bVar1) {
    RVar2 = ParseTerminatingInstrList(this,out_expr_list);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      RVar2 = Expect(this,Rpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    bVar1 = PeekMatchExpr(this);
    if (bVar1) {
      RVar2 = ParseExpr(this,out_expr_list);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseOffsetExprOpt(ExprList* out_expr_list) {
  WABT_TRACE(ParseOffsetExprOpt);
  if (MatchLpar(TokenType::Offset)) {
    CHECK_RESULT(ParseTerminatingInstrList(out_expr_list));
    EXPECT(Rpar);
    return true;
  } else if (PeekMatchExpr()) {
    CHECK_RESULT(ParseExpr(out_expr_list));
    return true;
  } else {
    return false;
  }
}